

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdCircularList.h
# Opt level: O3

double __thiscall HACD::ICHUll::ComputeVolume(ICHUll *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  size_t sVar10;
  CircularListElement<HACD::TMMVertex> *pCVar11;
  CircularListElement<HACD::TMMVertex> *pCVar12;
  CircularListElement<HACD::TMMTriangle> *pCVar13;
  size_t sVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 in_ZMM2 [64];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  sVar10 = (this->m_mesh).m_vertices.m_size;
  dVar15 = 0.0;
  if ((sVar10 != 0) && (this->m_isFlat == false)) {
    pCVar12 = (this->m_mesh).m_vertices.m_head;
    dVar17 = 0.0;
    sVar14 = sVar10;
    auVar24 = ZEXT816(0) << 0x40;
    do {
      dVar17 = dVar17 + (pCVar12->m_data).m_pos.m_data[0];
      auVar16._0_8_ = auVar24._0_8_ + (pCVar12->m_data).m_pos.m_data[1];
      auVar16._8_8_ = auVar24._8_8_ + (pCVar12->m_data).m_pos.m_data[2];
      pCVar12 = pCVar12->m_next;
      sVar14 = sVar14 - 1;
      (this->m_mesh).m_vertices.m_head = pCVar12;
      auVar24 = auVar16;
    } while (sVar14 != 0);
    sVar14 = (this->m_mesh).m_triangles.m_size;
    if (sVar14 == 0) {
      return 0.0;
    }
    auVar24 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,sVar10);
    pCVar13 = (this->m_mesh).m_triangles.m_head;
    dVar19 = auVar24._0_8_;
    dVar18 = auVar16._0_8_ / dVar19;
    auVar24 = vshufpd_avx(auVar16,auVar16,1);
    dVar17 = dVar17 / dVar19;
    dVar19 = auVar24._0_8_ / dVar19;
    dVar15 = 0.0;
    do {
      pCVar12 = (pCVar13->m_data).m_vertices[1];
      pCVar11 = (pCVar13->m_data).m_vertices[0];
      sVar14 = sVar14 - 1;
      dVar1 = (pCVar12->m_data).m_pos.m_data[0];
      dVar2 = (pCVar12->m_data).m_pos.m_data[1];
      dVar3 = (pCVar12->m_data).m_pos.m_data[2];
      pCVar12 = (pCVar13->m_data).m_vertices[2];
      dVar4 = (pCVar11->m_data).m_pos.m_data[1];
      dVar5 = (pCVar11->m_data).m_pos.m_data[0];
      dVar6 = (pCVar11->m_data).m_pos.m_data[2];
      pCVar13 = pCVar13->m_next;
      dVar7 = (pCVar12->m_data).m_pos.m_data[1];
      dVar8 = (pCVar12->m_data).m_pos.m_data[2];
      dVar9 = (pCVar12->m_data).m_pos.m_data[0];
      (this->m_mesh).m_triangles.m_head = pCVar13;
      dVar3 = dVar3 - dVar19;
      dVar1 = dVar1 - dVar17;
      dVar2 = dVar2 - dVar18;
      dVar7 = dVar7 - dVar18;
      dVar8 = dVar8 - dVar19;
      dVar9 = dVar9 - dVar17;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar2;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar8;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar7 * dVar3;
      auVar24 = vfmsub231sd_fma(auVar31,auVar24,auVar29);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar3;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar9;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar8 * dVar1;
      auVar16 = vfmsub231sd_fma(auVar30,auVar27,auVar26);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar9 * dVar2;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar7;
      auVar23 = vfmsub231sd_fma(auVar25,auVar23,auVar28);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar5 - dVar17;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar16._0_8_ * (dVar4 - dVar18);
      auVar24 = vfmadd231sd_fma(auVar21,auVar20,auVar24);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar6 - dVar19;
      auVar24 = vfmadd213sd_fma(auVar23,auVar22,auVar24);
      dVar15 = auVar24._0_8_ + dVar15;
    } while (sVar14 != 0);
  }
  return dVar15;
}

Assistant:

size_t                                  GetSize() const { return m_size; }